

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml_print.hpp
# Opt level: O3

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 rapidxml::internal::print_declaration_node<std::back_insert_iterator<std::__cxx11::string>,char>
           (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            out,xml_node<char> *node,int flags,int indent)

{
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  bVar1;
  char cVar2;
  
  cVar2 = (char)out.container;
  if (0 < indent && (flags & 1U) == 0) {
    do {
      std::__cxx11::string::push_back(cVar2);
      indent = indent + -1;
    } while (indent != 0);
  }
  std::__cxx11::string::push_back(cVar2);
  std::__cxx11::string::push_back(cVar2);
  std::__cxx11::string::push_back(cVar2);
  std::__cxx11::string::push_back(cVar2);
  std::__cxx11::string::push_back(cVar2);
  bVar1 = print_attributes<std::back_insert_iterator<std::__cxx11::string>,char>(out,node,flags);
  std::__cxx11::string::push_back((char)bVar1.container);
  std::__cxx11::string::push_back((char)bVar1.container);
  return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )bVar1.container;
}

Assistant:

inline OutIt print_declaration_node(OutIt out, const xml_node<Ch> *node, int flags, int indent)
        {
            // Print declaration start
            if (!(flags & print_no_indenting))
                out = fill_chars(out, indent, Ch('\t'));
            *out = Ch('<'), ++out;
            *out = Ch('?'), ++out;
            *out = Ch('x'), ++out;
            *out = Ch('m'), ++out;
            *out = Ch('l'), ++out;

            // Print attributes
            out = print_attributes(out, node, flags);
            
            // Print declaration end
            *out = Ch('?'), ++out;
            *out = Ch('>'), ++out;
            
            return out;
        }